

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O2

LY_ERR lys_compile_node_deviations_refines
                 (lysc_ctx *ctx,lysp_node *pnode,lysc_node *parent,lysp_node **dev_pnode,
                 ly_bool *not_supported)

{
  lysp_ext_instance **pplVar1;
  lysp_node **type;
  char cVar2;
  ushort uVar3;
  uint uVar4;
  lyd_node *plVar5;
  lyd_node *plVar6;
  undefined8 *puVar7;
  lysp_module *plVar8;
  lysc_node *plVar9;
  lysp_restr *plVar10;
  lysp_module *plVar11;
  ly_bool lVar12;
  ushort uVar13;
  LY_ERR LVar14;
  ly_stmt lVar15;
  int iVar16;
  char *pcVar17;
  ulong uVar18;
  long *plVar19;
  lysp_restr **pplVar20;
  lysp_ext_instance *plVar21;
  lysp_node *plVar22;
  void *pvVar23;
  char *pcVar24;
  long lVar25;
  LY_VECODE code;
  void *pvVar26;
  size_t sVar27;
  lysp_node *plVar28;
  ulong uVar29;
  lysp_ext_instance *plVar30;
  long lVar31;
  undefined8 *puVar32;
  lysp_qname *plVar33;
  ly_ctx *plVar34;
  char *pcVar35;
  char *pcVar36;
  undefined8 uVar37;
  lysp_node *plVar38;
  ulong uVar39;
  lys_module *plVar40;
  uint16_t uVar41;
  char *pcVar42;
  char local_1028 [4088];
  
  *dev_pnode = (lysp_node *)0x0;
  *not_supported = '\0';
  pcVar35 = ctx->path;
  uVar29 = 0;
  while (uVar29 < (ctx->uses_rfns).count) {
    plVar5 = (ctx->uses_rfns).field_2.dnodes[uVar29];
    plVar40 = ctx->cur_mod;
    lVar12 = lysp_schema_nodeid_match
                       (*(lysc_nodeid **)plVar5,(lysp_module *)plVar5->schema,
                        (lysp_ext_instance *)0x0,(lysc_node *)plVar5->parent,parent,pnode,plVar40,
                        ctx->ext);
    if (lVar12 == '\0') {
      uVar29 = uVar29 + 1;
    }
    else {
      if ((*dev_pnode == (lysp_node *)0x0) &&
         (LVar14 = lysp_dup_single(ctx,pnode,(ly_bool)dev_pnode,(lysp_node **)plVar40),
         LVar14 != LY_SUCCESS)) goto LAB_0014c806;
      pvVar26 = (void *)0x0;
      while( true ) {
        plVar6 = plVar5->prev;
        if (plVar6 == (lyd_node *)0x0) {
          pvVar23 = (void *)0x0;
        }
        else {
          pvVar23 = plVar6[-1].priv;
        }
        if (pvVar23 <= pvVar26) break;
        puVar7 = *(undefined8 **)(&plVar6->hash + (long)pvVar26 * 2);
        plVar8 = (lysp_module *)plVar5->schema;
        plVar22 = *dev_pnode;
        plVar40 = ctx->cur_mod;
        plVar11 = ctx->pmod;
        ctx->cur_mod = plVar8->mod;
        ctx->pmod = plVar8;
        lysc_update_path(ctx,(lys_module *)0x0,"{refine}");
        lysc_update_path(ctx,(lys_module *)0x0,(char *)*puVar7);
        lVar25 = puVar7[6];
        if (lVar25 == 0) {
LAB_0014abc6:
          if (puVar7[1] == 0) {
LAB_0014abf6:
            if (puVar7[2] != 0) {
              lydict_remove(ctx->ctx,plVar22->ref);
              LVar14 = lydict_dup(ctx->ctx,(char *)puVar7[2],&plVar22->ref);
              if (LVar14 != LY_SUCCESS) goto LAB_0014b25c;
            }
            uVar13 = *(ushort *)(puVar7 + 9);
            if ((uVar13 & 3) != 0) {
              uVar4 = ctx->compile_opts;
              if ((uVar4 & 4) == 0) {
                plVar22->flags = uVar13 & 3 | plVar22->flags & 0xfffc;
              }
              else {
                pcVar17 = "notification";
                if ((uVar4 >> 0xe & 1) == 0) {
                  pcVar17 = "a subtree ignoring config";
                }
                if ((uVar4 & 0x3000) != 0) {
                  pcVar17 = "RPC/action";
                }
                ly_log(ctx->ctx,LY_LLWRN,LY_SUCCESS,"Refining config inside %s has no effect (%s).",
                       pcVar17,pcVar35);
                uVar13 = *(ushort *)(puVar7 + 9);
              }
            }
            if ((uVar13 & 0x60) != 0) {
              uVar3 = plVar22->nodetype;
              if (((0x20 < (ulong)uVar3) || ((0x100000014U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) &&
                 (uVar3 != 0x60)) {
                plVar34 = ctx->ctx;
                pcVar17 = lys_nodetype2str(uVar3);
                pcVar42 = "mandatory";
                goto LAB_0014b242;
              }
              plVar22->flags = uVar13 & 0x60 | plVar22->flags & 0xff9f;
            }
            if (puVar7[5] != 0) {
              plVar34 = ctx->ctx;
              if (plVar22->nodetype != 1) {
                pcVar17 = lys_nodetype2str(plVar22->nodetype);
                pcVar42 = "presence";
                goto LAB_0014b242;
              }
              lydict_remove(plVar34,(char *)plVar22[1].next);
              LVar14 = lydict_dup(ctx->ctx,(char *)puVar7[5],(char **)&plVar22[1].next);
              if (LVar14 != LY_SUCCESS) goto LAB_0014b25c;
            }
            if (puVar7[4] == 0) {
LAB_0014ae7a:
              uVar4 = *(uint *)(puVar7 + 9);
              if ((uVar4 >> 9 & 1) != 0) {
                uVar41 = plVar22->nodetype;
                if (uVar41 == 8) {
                  lVar25 = 200;
                }
                else {
                  if (uVar41 != 0x10) {
                    plVar34 = ctx->ctx;
                    pcVar17 = lys_nodetype2str(uVar41);
                    pcVar42 = "min-elements";
                    goto LAB_0014b242;
                  }
                  lVar25 = 0x88;
                }
                *(undefined4 *)((long)&plVar22->parent + lVar25) = *(undefined4 *)(puVar7 + 7);
              }
              if ((uVar4 >> 10 & 1) != 0) {
                uVar41 = plVar22->nodetype;
                if (uVar41 == 8) {
                  lVar25 = 0xcc;
                }
                else {
                  if (uVar41 != 0x10) {
                    plVar34 = ctx->ctx;
                    pcVar17 = lys_nodetype2str(uVar41);
                    pcVar42 = "max-elements";
                    goto LAB_0014b242;
                  }
                  lVar25 = 0x8c;
                }
                *(undefined4 *)((long)&plVar22->parent + lVar25) =
                     *(undefined4 *)((long)puVar7 + 0x3c);
              }
              if (puVar7[3] == 0) {
LAB_0014b17d:
                lVar25 = puVar7[8];
                LVar14 = LY_SUCCESS;
                if (lVar25 != 0) {
                  plVar30 = plVar22->exts;
                  if (plVar30 == (lysp_ext_instance *)0x0) {
                    plVar19 = (long *)calloc(1,*(long *)(lVar25 + -8) * 0x70 | 8);
                    if (plVar19 == (long *)0x0) goto LAB_0014c837;
                    lVar25 = 0;
                    plVar21 = (lysp_ext_instance *)0x0;
                  }
                  else {
                    plVar21 = plVar30[-1].exts;
                    plVar19 = (long *)realloc(&plVar30[-1].exts,
                                              ((long)&plVar21->name + *(long *)(lVar25 + -8)) * 0x70
                                              | 8);
                    if (plVar19 == (long *)0x0) {
LAB_0014c837:
                      plVar34 = ctx->ctx;
                      pcVar35 = "lys_apply_refine";
                      goto LAB_0014c849;
                    }
                    lVar25 = *plVar19;
                  }
                  plVar22->exts = (lysp_ext_instance *)(plVar19 + 1);
                  if (puVar7[8] == 0) {
                    sVar27 = 0;
                  }
                  else {
                    sVar27 = *(long *)(puVar7[8] + -8) * 0x70;
                  }
                  memset(plVar19 + lVar25 * 0xe + 1,0,sVar27);
                  uVar39 = 0xffffffffffffffff;
                  lVar25 = 0;
                  while( true ) {
                    if (puVar7[8] == 0) {
                      uVar18 = 0;
                    }
                    else {
                      uVar18 = *(ulong *)(puVar7[8] + -8);
                    }
                    uVar39 = uVar39 + 1;
                    LVar14 = LY_SUCCESS;
                    if (uVar18 <= uVar39) break;
                    pplVar1 = &plVar22->exts[-1].exts;
                    *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)->name + 1);
                    plVar34 = ctx->ctx;
                    lVar15 = lyplg_ext_nodetype2stmt(plVar22->nodetype);
                    LVar14 = lysp_ext_dup(plVar34,plVar8,plVar22,lVar15,
                                          (lysp_ext_instance *)(puVar7[8] + lVar25),
                                          (lysp_ext_instance *)
                                          ((long)&plVar22->exts[(long)plVar21].name + lVar25));
                    lVar25 = lVar25 + 0x70;
                    if (LVar14 != LY_SUCCESS) goto LAB_0014c806;
                  }
                }
              }
              else {
                uVar13 = plVar22->nodetype;
                if (((0x20 < (ulong)uVar13) || ((0x100010116U >> ((ulong)uVar13 & 0x3f) & 1) == 0))
                   && ((uVar13 != 0x60 && (uVar13 != 0x80)))) {
                  plVar34 = ctx->ctx;
                  pcVar17 = lys_nodetype2str(uVar13);
                  pcVar42 = "if-feature";
                  goto LAB_0014b209;
                }
                uVar39 = 0xffffffffffffffff;
                lVar25 = 0;
                do {
                  if (puVar7[3] == 0) {
                    uVar18 = 0;
                  }
                  else {
                    uVar18 = *(ulong *)(puVar7[3] + -8);
                  }
                  uVar39 = uVar39 + 1;
                  if (uVar18 <= uVar39) goto LAB_0014b17d;
                  plVar33 = plVar22->iffeatures;
                  if (plVar33 != (lysp_qname *)0x0) {
                    lVar31 = *(long *)&plVar33[-1].flags;
                    *(long *)&plVar33[-1].flags = lVar31 + 1;
                    plVar19 = (long *)realloc(&plVar33[-1].flags,lVar31 * 0x18 + 0x20);
                    if (plVar19 != (long *)0x0) {
                      lVar31 = *plVar19;
                      goto LAB_0014b127;
                    }
                    plVar22 = (lysp_node *)plVar22->iffeatures;
LAB_0014b373:
                    plVar22[-1].exts = (lysp_ext_instance *)((long)&plVar22[-1].exts[-1].exts + 7);
LAB_0014b377:
                    ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                           "lys_apply_refine");
                    LVar14 = LY_EMEM;
                    break;
                  }
                  plVar19 = (long *)malloc(0x20);
                  if (plVar19 == (long *)0x0) goto LAB_0014b377;
                  *plVar19 = 1;
                  lVar31 = 1;
LAB_0014b127:
                  plVar22->iffeatures = (lysp_qname *)(plVar19 + 1);
                  plVar19 = plVar19 + lVar31 * 3;
                  *plVar19 = 0;
                  ((lysp_qname *)(plVar19 + -2))->str = (char *)0x0;
                  plVar19[-1] = 0;
                  LVar14 = lysp_qname_dup(ctx->ctx,(lysp_qname *)(puVar7[3] + lVar25),
                                          (lysp_qname *)(plVar19 + -2));
                  lVar25 = lVar25 + 0x18;
                } while (LVar14 == LY_SUCCESS);
              }
            }
            else {
              uVar13 = plVar22->nodetype;
              if (((0x20 < (ulong)uVar13) || ((0x100010112U >> ((ulong)uVar13 & 0x3f) & 1) == 0)) &&
                 (uVar13 != 0x60)) {
                plVar34 = ctx->ctx;
                pcVar17 = lys_nodetype2str(uVar13);
                pcVar42 = "must";
LAB_0014b209:
                code = LYVE_REFERENCE;
                pcVar24 = "Invalid %s of %s node - it is not possible to %s \"%s\" property.";
                pcVar36 = "add";
                goto LAB_0014b24b;
              }
              uVar39 = 0xffffffffffffffff;
              lVar25 = 0;
              do {
                if (puVar7[4] == 0) {
                  uVar18 = 0;
                }
                else {
                  uVar18 = *(ulong *)(puVar7[4] + -8);
                }
                uVar39 = uVar39 + 1;
                if (uVar18 <= uVar39) goto LAB_0014ae7a;
                plVar38 = plVar22[1].parent;
                if (plVar38 == (lysp_node *)0x0) {
                  plVar19 = (long *)malloc(0x48);
                  if (plVar19 == (long *)0x0) goto LAB_0014b377;
                  *plVar19 = 1;
                  lVar31 = 1;
                }
                else {
                  plVar30 = (lysp_ext_instance *)((long)&(plVar38[-1].exts)->name + 1);
                  plVar38[-1].exts = plVar30;
                  plVar19 = (long *)realloc(&plVar38[-1].exts,(long)plVar30 * 0x40 | 8);
                  if (plVar19 == (long *)0x0) {
                    plVar22 = plVar22[1].parent;
                    goto LAB_0014b373;
                  }
                  lVar31 = *plVar19;
                }
                plVar22[1].parent = (lysp_node *)(plVar19 + 1);
                plVar19 = plVar19 + lVar31 * 8;
                plVar19[-1] = 0;
                *plVar19 = 0;
                plVar19[-3] = 0;
                plVar19[-2] = 0;
                plVar19[-5] = 0;
                plVar19[-4] = 0;
                (((lysp_restr *)(plVar19 + -7))->arg).str = (char *)0x0;
                plVar19[-6] = 0;
                LVar14 = lysp_restr_dup(ctx->ctx,plVar8,(lysp_restr *)(puVar7[4] + lVar25),
                                        (lysp_restr *)(plVar19 + -7));
                lVar25 = lVar25 + 0x40;
              } while (LVar14 == LY_SUCCESS);
            }
          }
          else {
            lydict_remove(ctx->ctx,plVar22->dsc);
            LVar14 = lydict_dup(ctx->ctx,(char *)puVar7[1],&plVar22->dsc);
            if (LVar14 == LY_SUCCESS) goto LAB_0014abf6;
          }
        }
        else {
          uVar41 = plVar22->nodetype;
          if (uVar41 == 2) {
            plVar34 = ctx->ctx;
            if (*(ulong *)(lVar25 + -8) < 2) {
              plVar38 = (lysp_node *)&plVar22[1].next;
              plVar28 = plVar22[1].next;
LAB_0014aba6:
              lydict_remove(plVar34,(char *)plVar28);
              LVar14 = lysp_qname_dup(ctx->ctx,(lysp_qname *)puVar7[6],(lysp_qname *)plVar38);
              if (LVar14 != LY_SUCCESS) goto LAB_0014b25c;
              goto LAB_0014abc6;
            }
            uVar41 = 2;
LAB_0014ab0a:
            pcVar17 = lys_nodetype2str(uVar41);
            if (puVar7[6] == 0) {
              pcVar36 = (char *)0x0;
            }
            else {
              pcVar36 = *(char **)(puVar7[6] + -8);
            }
            code = LYVE_SEMANTICS;
            pcVar24 = "Invalid %s of %s with too many (%lu) %s properties.";
            pcVar42 = "default";
LAB_0014b24b:
            ly_vlog(plVar34,(char *)0x0,code,pcVar24,"refine",pcVar17,pcVar36,pcVar42);
          }
          else {
            if (uVar41 != 8) {
              if (uVar41 == 4) {
                plVar34 = ctx->ctx;
                if (*(ulong *)(lVar25 + -8) < 2) {
                  plVar38 = plVar22 + 3;
                  plVar28 = plVar22[3].parent;
                  goto LAB_0014aba6;
                }
                uVar41 = 4;
                goto LAB_0014ab0a;
              }
              plVar34 = ctx->ctx;
              pcVar17 = lys_nodetype2str(uVar41);
              pcVar42 = "default";
LAB_0014b242:
              code = LYVE_REFERENCE;
              pcVar24 = "Invalid %s of %s node - it is not possible to %s \"%s\" property.";
              pcVar36 = "replace";
              goto LAB_0014b24b;
            }
            if (1 < *(byte *)(*(long *)(lVar25 + 8) + 0x78)) {
              lVar25 = 0;
              plVar30 = (lysp_ext_instance *)0x0;
              while (plVar38 = plVar22[3].parent, plVar38 != (lysp_node *)0x0) {
                if (plVar38[-1].exts <= plVar30) {
                  free(&plVar38[-1].exts);
                  break;
                }
                lysp_qname_free(ctx->ctx,(lysp_qname *)((long)&plVar38->parent + lVar25));
                plVar30 = (lysp_ext_instance *)((long)&plVar30->name + 1);
                lVar25 = lVar25 + 0x18;
              }
              plVar22[3].parent = (lysp_node *)0x0;
              uVar39 = 0xffffffffffffffff;
              lVar25 = 0;
              do {
                if (puVar7[6] == 0) {
                  uVar18 = 0;
                }
                else {
                  uVar18 = *(ulong *)(puVar7[6] + -8);
                }
                uVar39 = uVar39 + 1;
                if (uVar18 <= uVar39) goto LAB_0014abc6;
                plVar38 = plVar22[3].parent;
                if (plVar38 == (lysp_node *)0x0) {
                  plVar19 = (long *)malloc(0x20);
                  if (plVar19 == (long *)0x0) goto LAB_0014b377;
                  *plVar19 = 1;
                  lVar31 = 1;
                }
                else {
                  plVar30 = plVar38[-1].exts;
                  plVar38[-1].exts = (lysp_ext_instance *)((long)&plVar30->name + 1);
                  plVar19 = (long *)realloc(&plVar38[-1].exts,(long)plVar30 * 0x18 + 0x20);
                  if (plVar19 == (long *)0x0) {
                    plVar22 = plVar22[3].parent;
                    goto LAB_0014b373;
                  }
                  lVar31 = *plVar19;
                }
                plVar22[3].parent = (lysp_node *)(plVar19 + 1);
                plVar19 = plVar19 + lVar31 * 3;
                *plVar19 = 0;
                ((lysp_qname *)(plVar19 + -2))->str = (char *)0x0;
                plVar19[-1] = 0;
                LVar14 = lysp_qname_dup(ctx->ctx,(lysp_qname *)(puVar7[6] + lVar25),
                                        (lysp_qname *)(plVar19 + -2));
                lVar25 = lVar25 + 0x18;
              } while (LVar14 == LY_SUCCESS);
              goto LAB_0014b25c;
            }
            ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                    "Invalid refine of default in leaf-list - the default statement is allowed only in YANG 1.1 modules."
                   );
          }
          LVar14 = LY_EVALID;
        }
LAB_0014b25c:
        ctx->cur_mod = plVar40;
        ctx->pmod = plVar11;
        lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
        lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
        pvVar26 = (void *)((long)pvVar26 + 1);
        if (LVar14 != LY_SUCCESS) goto LAB_0014c806;
      }
      lysc_refine_free(ctx->ctx,(lysc_refine *)plVar5);
      ly_set_rm_index(&ctx->uses_rfns,(uint32_t)uVar29,(_func_void_void_ptr *)0x0);
    }
  }
  uVar29 = 0;
  while( true ) {
    if ((ctx->devs).count <= uVar29) {
      return LY_SUCCESS;
    }
    plVar5 = (ctx->devs).field_2.dnodes[uVar29];
    plVar40 = ctx->cur_mod;
    lVar12 = lysp_schema_nodeid_match
                       (*(lysc_nodeid **)plVar5,*(lysp_module **)&plVar5->parent->field_0,
                        (lysp_ext_instance *)0x0,(lysc_node *)0x0,parent,pnode,plVar40,ctx->ext);
    if (lVar12 != '\0') break;
    uVar29 = uVar29 + 1;
  }
  if (*(ly_bool *)&plVar5->next == '\0') {
    if ((*dev_pnode != (lysp_node *)0x0) ||
       (LVar14 = lysp_dup_single(ctx,pnode,(ly_bool)dev_pnode,(lysp_node **)plVar40),
       LVar14 == LY_SUCCESS)) {
      pvVar26 = (void *)0x0;
      do {
        plVar9 = plVar5->schema;
        if (plVar9 == (lysc_node *)0x0) {
          pvVar23 = (void *)0x0;
        }
        else {
          pvVar23 = plVar9[-1].priv;
        }
        if (pvVar23 <= pvVar26) goto LAB_0014b42a;
        puVar7 = *(undefined8 **)(plVar9->hash + (long)pvVar26 * 8 + -4);
        plVar8 = *(lysp_module **)((long)&plVar5->parent->field_0 + (long)pvVar26 * 8);
        plVar38 = *dev_pnode;
        plVar40 = ctx->cur_mod;
        plVar11 = ctx->pmod;
        strcpy(local_1028,pcVar35);
        ctx->path_len = 1;
        ctx->cur_mod = plVar8->mod;
        ctx->pmod = plVar8;
        lysc_update_path(ctx,(lys_module *)0x0,"{deviation}");
        lysc_update_path(ctx,(lys_module *)0x0,(char *)*puVar7);
        type = &plVar38[1].next;
        pplVar1 = &plVar38[2].exts;
        plVar22 = plVar38 + 3;
        for (pcVar17 = (char *)(puVar7 + 3); pcVar17 = *(char **)pcVar17, pcVar17 != (char *)0x0;
            pcVar17 = pcVar17 + 8) {
          cVar2 = *pcVar17;
          if (cVar2 == '\x04') {
            if (*(long *)(pcVar17 + 0x18) != 0) {
              uVar41 = plVar38->nodetype;
              if ((uVar41 == 4) || (uVar41 == 8)) {
                lysp_type_free(&ctx->free_ctx,(lysp_type *)type);
                lysp_type_dup(ctx->ctx,ctx->pmod,*(lysp_type **)(pcVar17 + 0x18),(lysp_type *)type);
                goto LAB_0014b7dc;
              }
              plVar34 = ctx->ctx;
              pcVar36 = lys_nodetype2str(uVar41);
LAB_0014c5c4:
              pcVar42 = "deviation";
              pcVar17 = "Invalid %s of %s node - it is not possible to %s \"%s\" property.";
              pcVar24 = "replace";
LAB_0014c5cf:
              ly_vlog(plVar34,(char *)0x0,LYVE_REFERENCE,pcVar17,pcVar42,pcVar36,pcVar24);
              goto LAB_0014c5d8;
            }
LAB_0014b7dc:
            pcVar24 = *(char **)(pcVar17 + 0x20);
            if ((lysp_ext_instance *)pcVar24 != (lysp_ext_instance *)0x0) {
              uVar41 = plVar38->nodetype;
              if ((uVar41 != 4) && (uVar41 != 8)) {
                plVar34 = ctx->ctx;
                pcVar36 = lys_nodetype2str(uVar41);
                goto LAB_0014c5c4;
              }
              plVar34 = ctx->ctx;
              if (*pplVar1 == (lysp_ext_instance *)0x0) {
                pcVar36 = "units";
LAB_0014c2a2:
                pcVar42 = "replacing";
                pcVar17 = "Invalid deviation %s \"%s\" property \"%s\" which is not present.";
                goto LAB_0014c5cf;
              }
              lydict_remove(plVar34,(char *)*pplVar1);
              LVar14 = lydict_dup(ctx->ctx,*(char **)(pcVar17 + 0x20),(char **)pplVar1);
              if (LVar14 == LY_SUCCESS) goto LAB_0014b827;
              goto LAB_0014c5de;
            }
LAB_0014b827:
            pcVar24 = *(char **)(pcVar17 + 0x28);
            if ((lysp_ext_instance *)pcVar24 != (lysp_ext_instance *)0x0) {
              uVar41 = plVar38->nodetype;
              if (uVar41 == 2) {
                plVar34 = ctx->ctx;
                if (*type == (lysp_node *)0x0) {
LAB_0014c284:
                  pcVar36 = "default";
                  goto LAB_0014c2a2;
                }
                lydict_remove(plVar34,(char *)*type);
                plVar34 = ctx->ctx;
                plVar28 = (lysp_node *)type;
              }
              else {
                if (uVar41 != 4) {
                  plVar34 = ctx->ctx;
                  pcVar36 = lys_nodetype2str(uVar41);
                  goto LAB_0014c5c4;
                }
                plVar34 = ctx->ctx;
                if (plVar22->parent == (lysp_node *)0x0) goto LAB_0014c284;
                lydict_remove(plVar34,(char *)plVar22->parent);
                plVar34 = ctx->ctx;
                plVar28 = plVar22;
              }
              LVar14 = lysp_qname_dup(plVar34,(lysp_qname *)(pcVar17 + 0x28),(lysp_qname *)plVar28);
              if (LVar14 != LY_SUCCESS) goto LAB_0014c5de;
            }
            uVar13 = *(ushort *)(pcVar17 + 0x40);
            if ((uVar13 & 3) != 0) {
              uVar3 = plVar38->nodetype;
              if (((0x20 < (ulong)uVar3) || ((0x100010116U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) &&
                 (uVar3 != 0x60)) {
                plVar34 = ctx->ctx;
                pcVar36 = lys_nodetype2str(uVar3);
                goto LAB_0014c5c4;
              }
              plVar38->flags = uVar13 & 3 | plVar38->flags & 0xfffc;
            }
            if ((uVar13 & 0x60) != 0) {
              uVar3 = plVar38->nodetype;
              if (((0x20 < (ulong)uVar3) || ((0x100000014U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) &&
                 (uVar3 != 0x60)) {
                plVar34 = ctx->ctx;
                pcVar36 = lys_nodetype2str(uVar3);
                goto LAB_0014c5c4;
              }
              plVar38->flags = uVar13 & 0x60 | plVar38->flags & 0xff9f;
            }
            if ((uVar13 >> 9 & 1) != 0) {
              uVar41 = plVar38->nodetype;
              lVar25 = 200;
              if (uVar41 != 8) {
                if (uVar41 != 0x10) {
                  plVar34 = ctx->ctx;
                  pcVar36 = lys_nodetype2str(uVar41);
                  goto LAB_0014c5c4;
                }
                lVar25 = 0x88;
              }
              *(undefined4 *)((long)&plVar38->parent + lVar25) = *(undefined4 *)(pcVar17 + 0x44);
            }
            if ((uVar13 >> 10 & 1) == 0) goto LAB_0014bf52;
            uVar41 = plVar38->nodetype;
            lVar25 = 0xcc;
            if (uVar41 != 8) {
              if (uVar41 != 0x10) {
                plVar34 = ctx->ctx;
                pcVar36 = lys_nodetype2str(uVar41);
                goto LAB_0014c5c4;
              }
              lVar25 = 0x8c;
            }
            *(undefined4 *)((long)&plVar38->parent + lVar25) = *(undefined4 *)(pcVar17 + 0x48);
          }
          else {
            if (cVar2 != '\x03') {
              if (cVar2 == '\x02') {
                if (*(char **)(pcVar17 + 0x18) == (char *)0x0) {
LAB_0014b596:
                  if (*(long *)(pcVar17 + 0x20) != 0) {
                    pplVar20 = lysp_node_musts_p(plVar38);
                    if (pplVar20 == (lysp_restr **)0x0) {
                      plVar34 = ctx->ctx;
                      pcVar36 = lys_nodetype2str(plVar38->nodetype);
                      goto LAB_0014c37d;
                    }
                    uVar39 = 0xffffffffffffffff;
                    lVar25 = 0;
                    while( true ) {
                      if (*(long *)(pcVar17 + 0x20) == 0) {
                        uVar18 = 0;
                      }
                      else {
                        uVar18 = *(ulong *)(*(long *)(pcVar17 + 0x20) + -8);
                      }
                      uVar39 = uVar39 + 1;
                      if (uVar18 <= uVar39) break;
                      plVar10 = *pplVar20;
                      if (plVar10 == (lysp_restr *)0x0) {
                        plVar19 = (long *)malloc(0x48);
                        if (plVar19 == (long *)0x0) goto LAB_0014c03d;
                        *plVar19 = 1;
                      }
                      else {
                        plVar30 = (lysp_ext_instance *)((long)&(plVar10[-1].exts)->name + 1);
                        plVar10[-1].exts = plVar30;
                        plVar19 = (long *)realloc(&plVar10[-1].exts,(long)plVar30 * 0x40 | 8);
                        if (plVar19 == (long *)0x0) {
                          (*pplVar20)[-1].exts =
                               (lysp_ext_instance *)((long)&(*pplVar20)[-1].exts[-1].exts + 7);
                          goto LAB_0014c03d;
                        }
                      }
                      *pplVar20 = (lysp_restr *)(plVar19 + 1);
                      plVar19 = plVar19 + *plVar19 * 8;
                      plVar19[-1] = 0;
                      *plVar19 = 0;
                      plVar19[-3] = 0;
                      plVar19[-2] = 0;
                      plVar19[-5] = 0;
                      plVar19[-4] = 0;
                      (((lysp_restr *)(plVar19 + -7))->arg).str = (char *)0x0;
                      plVar19[-6] = 0;
                      LVar14 = lysp_restr_dup(ctx->ctx,ctx->pmod,
                                              (lysp_restr *)(*(long *)(pcVar17 + 0x20) + lVar25),
                                              (lysp_restr *)(plVar19 + -7));
                      lVar25 = lVar25 + 0x40;
                      if (LVar14 != LY_SUCCESS) goto LAB_0014c5de;
                    }
                  }
                  lVar25 = *(long *)(pcVar17 + 0x28);
                  if (lVar25 != 0) {
                    if (plVar38->nodetype != 0x10) {
                      plVar34 = ctx->ctx;
                      pcVar36 = lys_nodetype2str(plVar38->nodetype);
                      goto LAB_0014c37d;
                    }
                    lVar31 = 0;
                    uVar39 = 0;
                    while( true ) {
                      if (lVar25 == 0) {
                        uVar18 = 0;
                      }
                      else {
                        uVar18 = *(ulong *)(lVar25 + -8);
                      }
                      if (uVar18 <= uVar39) break;
                      plVar28 = plVar38[2].parent;
                      if (plVar28 == (lysp_node *)0x0) {
                        plVar19 = (long *)malloc(0x20);
                        if (plVar19 == (long *)0x0) goto LAB_0014c03d;
                        *plVar19 = 1;
                        lVar25 = 1;
                      }
                      else {
                        plVar30 = plVar28[-1].exts;
                        plVar28[-1].exts = (lysp_ext_instance *)((long)&plVar30->name + 1);
                        plVar19 = (long *)realloc(&plVar28[-1].exts,(long)plVar30 * 0x18 + 0x20);
                        if (plVar19 == (long *)0x0) {
                          plVar22 = plVar38[2].parent;
                          goto LAB_0014c039;
                        }
                        lVar25 = *plVar19;
                      }
                      plVar38[2].parent = (lysp_node *)(plVar19 + 1);
                      plVar19 = plVar19 + lVar25 * 3;
                      *plVar19 = 0;
                      ((lysp_qname *)(plVar19 + -2))->str = (char *)0x0;
                      plVar19[-1] = 0;
                      LVar14 = lysp_qname_dup(ctx->ctx,(lysp_qname *)
                                                       (*(long *)(pcVar17 + 0x28) + lVar31),
                                              (lysp_qname *)(plVar19 + -2));
                      if (LVar14 != LY_SUCCESS) goto LAB_0014c5de;
                      uVar39 = uVar39 + 1;
                      lVar25 = *(long *)(pcVar17 + 0x28);
                      lVar31 = lVar31 + 0x18;
                    }
                  }
                  plVar33 = *(lysp_qname **)(pcVar17 + 0x30);
                  if (plVar33 != (lysp_qname *)0x0) {
                    uVar41 = plVar38->nodetype;
                    if (uVar41 == 2) {
                      plVar28 = (lysp_node *)type;
                      if (1 < *(ulong *)&plVar33[-1].flags) goto LAB_0014c56b;
                    }
                    else {
                      if (uVar41 != 4) {
                        if (uVar41 == 8) {
                          lVar25 = 0;
                          uVar39 = 0;
LAB_0014b98d:
                          if (plVar33 == (lysp_qname *)0x0) {
                            uVar18 = 0;
                          }
                          else {
                            uVar18 = *(ulong *)&plVar33[-1].flags;
                          }
                          if (uVar39 < uVar18) {
                            plVar28 = plVar22->parent;
                            if (plVar28 == (lysp_node *)0x0) {
                              plVar19 = (long *)malloc(0x20);
                              if (plVar19 != (long *)0x0) {
                                *plVar19 = 1;
                                lVar31 = 1;
LAB_0014b9f6:
                                plVar22->parent = (lysp_node *)(plVar19 + 1);
                                plVar19 = plVar19 + lVar31 * 3;
                                *plVar19 = 0;
                                ((lysp_qname *)(plVar19 + -2))->str = (char *)0x0;
                                plVar19[-1] = 0;
                                LVar14 = lysp_qname_dup(ctx->ctx,(lysp_qname *)
                                                                 (*(long *)(pcVar17 + 0x30) + lVar25
                                                                 ),(lysp_qname *)(plVar19 + -2));
                                if (LVar14 == LY_SUCCESS) goto code_r0x0014ba32;
                                goto LAB_0014c5de;
                              }
                            }
                            else {
                              plVar30 = plVar28[-1].exts;
                              plVar28[-1].exts = (lysp_ext_instance *)((long)&plVar30->name + 1);
                              plVar19 = (long *)realloc(&plVar28[-1].exts,
                                                        (long)plVar30 * 0x18 + 0x20);
                              if (plVar19 != (long *)0x0) {
                                lVar31 = *plVar19;
                                goto LAB_0014b9f6;
                              }
                              plVar22 = plVar22->parent;
LAB_0014c039:
                              plVar22[-1].exts =
                                   (lysp_ext_instance *)((long)&plVar22[-1].exts[-1].exts + 7);
                            }
LAB_0014c03d:
                            ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                                   "lys_apply_deviate_add");
                            LVar14 = LY_EMEM;
                            goto LAB_0014c5de;
                          }
                          goto LAB_0014bb99;
                        }
                        plVar34 = ctx->ctx;
                        pcVar36 = lys_nodetype2str(uVar41);
                        goto LAB_0014c37d;
                      }
                      plVar28 = plVar22;
                      if (1 < *(ulong *)&plVar33[-1].flags) goto LAB_0014c573;
                    }
                    plVar30 = (lysp_ext_instance *)plVar28->parent;
                    plVar34 = ctx->ctx;
                    if (plVar30 != (lysp_ext_instance *)0x0) {
                      pcVar17 = 
                      "Invalid deviation adding \"%s\" property which already exists (with value \"%s\")."
                      ;
LAB_0014c0a5:
                      pcVar36 = "default";
                      goto LAB_0014bfc7;
                    }
                    LVar14 = lysp_qname_dup(plVar34,plVar33,(lysp_qname *)plVar28);
                    if (LVar14 != LY_SUCCESS) goto LAB_0014c5de;
                  }
LAB_0014bb99:
                  uVar13 = *(ushort *)(pcVar17 + 0x38);
                  if ((uVar13 & 3) == 0) {
LAB_0014bbe2:
                    if ((uVar13 & 0x60) != 0) {
                      uVar3 = plVar38->nodetype;
                      if (((0x20 < (ulong)uVar3) ||
                          ((0x100000014U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) && (uVar3 != 0x60)) {
                        plVar34 = ctx->ctx;
                        pcVar36 = lys_nodetype2str(uVar3);
                        goto LAB_0014c37d;
                      }
                      uVar3 = plVar38->flags;
                      if ((uVar3 & 0x60) != 0) {
                        plVar34 = ctx->ctx;
                        pcVar17 = "true";
                        if ((uVar3 & 0x20) == 0) {
                          pcVar17 = "false";
                        }
                        pcVar36 = 
                        "Invalid deviation adding \"mandatory\" property which already exists (with value \"mandatory %s\")."
                        ;
                        goto LAB_0014c4df;
                      }
                      plVar38->flags = uVar3 | uVar13 & 0x60;
                    }
                    if ((uVar13 >> 9 & 1) == 0) {
LAB_0014bc62:
                      if ((uVar13 >> 10 & 1) == 0) goto LAB_0014bf52;
                      uVar41 = plVar38->nodetype;
                      lVar25 = 0xcc;
                      if (uVar41 != 8) {
                        if (uVar41 != 0x10) {
                          plVar34 = ctx->ctx;
                          pcVar36 = lys_nodetype2str(uVar41);
                          goto LAB_0014c37d;
                        }
                        lVar25 = 0x8c;
                      }
                      if ((plVar38->flags & 0x400) == 0) {
                        *(undefined4 *)((long)&plVar38->parent + lVar25) =
                             *(undefined4 *)(pcVar17 + 0x40);
                        goto LAB_0014bf52;
                      }
                      uVar4 = *(uint *)((long)&plVar38->parent + lVar25);
                      plVar34 = ctx->ctx;
                      if (uVar4 == 0) {
                        ly_vlog(plVar34,(char *)0x0,LYVE_REFERENCE,
                                "Invalid deviation adding \"max-elements\" property which already exists (with value \"unbounded\")."
                               );
                        goto LAB_0014c5d8;
                      }
                      pcVar17 = 
                      "Invalid deviation adding \"max-elements\" property which already exists (with value \"%u\")."
                      ;
                    }
                    else {
                      uVar41 = plVar38->nodetype;
                      lVar25 = 200;
                      if (uVar41 != 8) {
                        if (uVar41 != 0x10) {
                          plVar34 = ctx->ctx;
                          pcVar36 = lys_nodetype2str(uVar41);
                          goto LAB_0014c37d;
                        }
                        lVar25 = 0x88;
                      }
                      if ((plVar38->flags & 0x200) == 0) {
                        *(undefined4 *)((long)&plVar38->parent + lVar25) =
                             *(undefined4 *)(pcVar17 + 0x3c);
                        goto LAB_0014bc62;
                      }
                      plVar34 = ctx->ctx;
                      uVar4 = *(uint *)((long)&plVar38->parent + lVar25);
                      pcVar17 = 
                      "Invalid deviation adding \"min-elements\" property which already exists (with value \"%u\")."
                      ;
                    }
                    ly_vlog(plVar34,(char *)0x0,LYVE_REFERENCE,pcVar17,(ulong)uVar4);
                  }
                  else {
                    uVar3 = plVar38->nodetype;
                    if (((0x20 < (ulong)uVar3) || ((0x100010116U >> ((ulong)uVar3 & 0x3f) & 1) == 0)
                        ) && (uVar3 != 0x60)) {
                      plVar34 = ctx->ctx;
                      pcVar36 = lys_nodetype2str(uVar3);
                      goto LAB_0014c37d;
                    }
                    uVar3 = plVar38->flags;
                    if ((uVar3 & 3) == 0) {
                      plVar38->flags = uVar3 | uVar13 & 3;
                      goto LAB_0014bbe2;
                    }
                    plVar34 = ctx->ctx;
                    pcVar17 = "true";
                    if ((uVar3 & 1) == 0) {
                      pcVar17 = "false";
                    }
                    pcVar36 = 
                    "Invalid deviation adding \"config\" property which already exists (with value \"config %s\")."
                    ;
LAB_0014c4df:
                    ly_vlog(plVar34,(char *)0x0,LYVE_REFERENCE,pcVar36,pcVar17);
                  }
LAB_0014c5d8:
                  LVar14 = LY_EVALID;
                }
                else {
                  uVar41 = plVar38->nodetype;
                  if ((uVar41 != 4) && (uVar41 != 8)) {
                    plVar34 = ctx->ctx;
                    pcVar36 = lys_nodetype2str(uVar41);
LAB_0014c37d:
                    pcVar42 = "deviation";
                    pcVar17 = "Invalid %s of %s node - it is not possible to %s \"%s\" property.";
                    pcVar24 = "add";
                    goto LAB_0014c5cf;
                  }
                  plVar30 = *pplVar1;
                  plVar34 = ctx->ctx;
                  if (plVar30 != (lysp_ext_instance *)0x0) {
                    pcVar17 = 
                    "Invalid deviation adding \"%s\" property which already exists (with value \"%s\")."
                    ;
                    pcVar36 = "units";
LAB_0014bfc7:
                    ly_vlog(plVar34,(char *)0x0,LYVE_REFERENCE,pcVar17,pcVar36,plVar30);
                    goto LAB_0014c5d8;
                  }
                  LVar14 = lydict_dup(plVar34,*(char **)(pcVar17 + 0x18),(char **)pplVar1);
                  if (LVar14 == LY_SUCCESS) goto LAB_0014b596;
                }
              }
              else {
                ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                       ,0x62f);
                LVar14 = LY_EINT;
              }
              goto LAB_0014c5de;
            }
            pcVar24 = *(char **)(pcVar17 + 0x18);
            if ((lysp_ext_instance *)pcVar24 != (lysp_ext_instance *)0x0) {
              uVar41 = plVar38->nodetype;
              if ((uVar41 == 4) || (uVar41 == 8)) {
                plVar30 = *pplVar1;
                if (plVar30 == (lysp_ext_instance *)0x0) {
                  plVar34 = ctx->ctx;
                  pcVar17 = "Invalid deviation %s \"%s\" property \"%s\" which is not present.";
                  pcVar42 = "deleting";
                  pcVar36 = "units";
                }
                else {
                  iVar16 = strcmp((char *)plVar30,pcVar24);
                  plVar34 = ctx->ctx;
                  if (iVar16 == 0) {
                    lydict_remove(plVar34,(char *)plVar30);
                    *pplVar1 = (lysp_ext_instance *)0x0;
                    goto LAB_0014b6c7;
                  }
                  pcVar17 = 
                  "Invalid deviation deleting \"%s\" property \"%s\" which does not match the target\'s property value \"%s\"."
                  ;
                  pcVar42 = "units";
                  pcVar36 = pcVar24;
                  pcVar24 = (char *)plVar30;
                }
              }
              else {
                plVar34 = ctx->ctx;
                pcVar36 = lys_nodetype2str(uVar41);
LAB_0014c41f:
                pcVar42 = "deviation";
                pcVar17 = "Invalid %s of %s node - it is not possible to %s \"%s\" property.";
                pcVar24 = "delete";
              }
              goto LAB_0014c5cf;
            }
LAB_0014b6c7:
            if (*(long *)(pcVar17 + 0x20) != 0) {
              pplVar20 = lysp_node_musts_p(plVar38);
              if (pplVar20 == (lysp_restr **)0x0) {
                plVar34 = ctx->ctx;
                pcVar36 = lys_nodetype2str(plVar38->nodetype);
                goto LAB_0014c41f;
              }
              uVar39 = 0;
              while( true ) {
                lVar25 = *(long *)(pcVar17 + 0x20);
                if (lVar25 == 0) {
                  uVar18 = 0;
                }
                else {
                  uVar18 = *(ulong *)(lVar25 + -8);
                }
                plVar10 = *pplVar20;
                if (uVar18 <= uVar39) break;
                puVar32 = (undefined8 *)(lVar25 + uVar39 * 0x40);
                lVar25 = 0;
                plVar30 = (lysp_ext_instance *)0x0;
                while( true ) {
                  if (plVar10 == (lysp_restr *)0x0) {
                    plVar21 = (lysp_ext_instance *)0x0;
                  }
                  else {
                    plVar21 = plVar10[-1].exts;
                  }
                  if (plVar21 <= plVar30) {
                    plVar34 = ctx->ctx;
                    plVar30 = (lysp_ext_instance *)*puVar32;
                    pcVar17 = 
                    "Invalid deviation deleting \"%s\" property \"%s\" which does not match any of the target\'s property values."
                    ;
                    pcVar36 = "must";
                    goto LAB_0014bfc7;
                  }
                  iVar16 = strcmp((char *)*puVar32,*(char **)((long)&(plVar10->arg).str + lVar25));
                  if (iVar16 == 0) break;
                  plVar30 = (lysp_ext_instance *)((long)&plVar30->name + 1);
                  lVar25 = lVar25 + 0x40;
                }
                plVar10[-1].exts = (lysp_ext_instance *)((long)&plVar10[-1].exts[-1].exts + 7);
                lysp_restr_free(&ctx->free_ctx,(lysp_restr *)((long)&(plVar10->arg).str + lVar25));
                plVar10 = *pplVar20;
                if ((plVar10 != (lysp_restr *)0x0) &&
                   (lVar31 = (long)plVar10[-1].exts - (long)plVar30,
                   plVar30 <= plVar10[-1].exts && lVar31 != 0)) {
                  memmove((void *)((long)&(plVar10->arg).str + lVar25),
                          (void *)((long)&plVar10[1].arg.str + lVar25),lVar31 * 0x40);
                }
                uVar39 = uVar39 + 1;
              }
              if (plVar10 != (lysp_restr *)0x0) {
                if (plVar10[-1].exts != (lysp_ext_instance *)0x0) goto LAB_0014bcc3;
                free(&plVar10[-1].exts);
              }
              *pplVar20 = (lysp_restr *)0x0;
            }
LAB_0014bcc3:
            lVar25 = *(long *)(pcVar17 + 0x28);
            if (lVar25 != 0) {
              if (plVar38->nodetype != 0x10) {
                plVar34 = ctx->ctx;
                pcVar36 = lys_nodetype2str(plVar38->nodetype);
                goto LAB_0014c41f;
              }
              uVar39 = 0;
              while( true ) {
                if (lVar25 == 0) {
                  uVar18 = 0;
                }
                else {
                  uVar18 = *(ulong *)(lVar25 + -8);
                }
                plVar28 = plVar38[2].parent;
                if (uVar18 <= uVar39) break;
                puVar32 = (undefined8 *)(lVar25 + uVar39 * 0x18);
                lVar25 = 0;
                plVar30 = (lysp_ext_instance *)0x0;
                while( true ) {
                  if (plVar28 == (lysp_node *)0x0) {
                    plVar21 = (lysp_ext_instance *)0x0;
                  }
                  else {
                    plVar21 = plVar28[-1].exts;
                  }
                  if (plVar21 <= plVar30) {
                    plVar34 = ctx->ctx;
                    plVar30 = (lysp_ext_instance *)*puVar32;
                    pcVar17 = 
                    "Invalid deviation deleting \"%s\" property \"%s\" which does not match any of the target\'s property values."
                    ;
                    pcVar36 = "unique";
                    goto LAB_0014bfc7;
                  }
                  iVar16 = strcmp((char *)*puVar32,*(char **)((long)&plVar28->parent + lVar25));
                  if (iVar16 == 0) break;
                  plVar30 = (lysp_ext_instance *)((long)&plVar30->name + 1);
                  lVar25 = lVar25 + 0x18;
                }
                plVar28[-1].exts = (lysp_ext_instance *)((long)&plVar28[-1].exts[-1].exts + 7);
                lysp_qname_free(ctx->ctx,(lysp_qname *)((long)&plVar28->parent + lVar25));
                plVar28 = plVar38[2].parent;
                if ((plVar28 != (lysp_node *)0x0) &&
                   (lVar31 = (long)plVar28[-1].exts - (long)plVar30,
                   plVar30 <= plVar28[-1].exts && lVar31 != 0)) {
                  memmove((void *)((long)&plVar28->parent + lVar25),
                          (void *)((long)&plVar28->name + lVar25),lVar31 * 0x18);
                }
                uVar39 = uVar39 + 1;
                lVar25 = *(long *)(pcVar17 + 0x28);
              }
              if (plVar28 != (lysp_node *)0x0) {
                if (plVar28[-1].exts != (lysp_ext_instance *)0x0) goto LAB_0014bdca;
                free(&plVar28[-1].exts);
              }
              plVar38[2].parent = (lysp_node *)0x0;
            }
LAB_0014bdca:
            puVar32 = *(undefined8 **)(pcVar17 + 0x30);
            if (puVar32 != (undefined8 *)0x0) {
              uVar41 = plVar38->nodetype;
              if (uVar41 != 2) {
                if (uVar41 == 4) {
                  if (1 < (ulong)puVar32[-1]) {
LAB_0014c573:
                    plVar34 = ctx->ctx;
                    uVar41 = 4;
                    goto LAB_0014c579;
                  }
                  pcVar24 = (char *)plVar22->parent;
                  if ((lysp_ext_instance *)pcVar24 == (lysp_ext_instance *)0x0) goto LAB_0014c6d5;
                  pcVar36 = (char *)*puVar32;
                  iVar16 = strcmp(pcVar24,pcVar36);
                  plVar34 = ctx->ctx;
                  if (iVar16 != 0) goto LAB_0014c733;
                  lydict_remove(plVar34,pcVar24);
                  plVar22->parent = (lysp_node *)0x0;
                }
                else {
                  if (uVar41 != 8) {
                    plVar34 = ctx->ctx;
                    pcVar36 = lys_nodetype2str(uVar41);
                    goto LAB_0014c41f;
                  }
                  uVar39 = 0;
                  while( true ) {
                    if (puVar32 == (undefined8 *)0x0) {
                      uVar18 = 0;
                    }
                    else {
                      uVar18 = puVar32[-1];
                    }
                    plVar28 = plVar22->parent;
                    if (uVar18 <= uVar39) break;
                    lVar25 = 0;
                    plVar30 = (lysp_ext_instance *)0x0;
                    while( true ) {
                      if (plVar28 == (lysp_node *)0x0) {
                        plVar21 = (lysp_ext_instance *)0x0;
                      }
                      else {
                        plVar21 = plVar28[-1].exts;
                      }
                      if (plVar21 <= plVar30) {
                        plVar34 = ctx->ctx;
                        plVar30 = (lysp_ext_instance *)puVar32[uVar39 * 3];
                        pcVar17 = 
                        "Invalid deviation deleting \"%s\" property \"%s\" which does not match any of the target\'s property values."
                        ;
                        goto LAB_0014c0a5;
                      }
                      iVar16 = strcmp((char *)puVar32[uVar39 * 3],
                                      *(char **)((long)&plVar28->parent + lVar25));
                      if (iVar16 == 0) break;
                      plVar30 = (lysp_ext_instance *)((long)&plVar30->name + 1);
                      lVar25 = lVar25 + 0x18;
                    }
                    plVar28[-1].exts = (lysp_ext_instance *)((long)&plVar28[-1].exts[-1].exts + 7);
                    lysp_qname_free(ctx->ctx,(lysp_qname *)((long)&plVar28->parent + lVar25));
                    plVar28 = plVar22->parent;
                    if ((plVar28 != (lysp_node *)0x0) &&
                       (lVar31 = (long)plVar28[-1].exts - (long)plVar30,
                       plVar30 <= plVar28[-1].exts && lVar31 != 0)) {
                      memmove((void *)((long)&plVar28->parent + lVar25),
                              (void *)((long)&plVar28->name + lVar25),lVar31 * 0x18);
                    }
                    uVar39 = uVar39 + 1;
                    puVar32 = *(undefined8 **)(pcVar17 + 0x30);
                  }
                  if (plVar28 != (lysp_node *)0x0) {
                    if (plVar28[-1].exts != (lysp_ext_instance *)0x0) goto LAB_0014bf52;
                    free(&plVar28[-1].exts);
                  }
                  plVar22->parent = (lysp_node *)0x0;
                }
                goto LAB_0014bf52;
              }
              if (1 < (ulong)puVar32[-1]) {
LAB_0014c56b:
                plVar34 = ctx->ctx;
                uVar41 = 2;
LAB_0014c579:
                pcVar36 = lys_nodetype2str(uVar41);
                if (*(long *)(pcVar17 + 0x30) == 0) {
                  uVar37 = 0;
                }
                else {
                  uVar37 = *(undefined8 *)(*(long *)(pcVar17 + 0x30) + -8);
                }
                ly_vlog(plVar34,(char *)0x0,LYVE_SEMANTICS,
                        "Invalid %s of %s with too many (%lu) %s properties.","deviation",pcVar36,
                        uVar37,"default");
                LVar14 = LY_EVALID;
                goto LAB_0014c5de;
              }
              pcVar24 = (char *)*type;
              if ((lysp_ext_instance *)pcVar24 == (lysp_ext_instance *)0x0) {
LAB_0014c6d5:
                plVar34 = ctx->ctx;
                pcVar17 = "Invalid deviation %s \"%s\" property \"%s\" which is not present.";
                pcVar42 = "deleting";
                pcVar36 = (char *)(lysp_ext_instance *)0x1b7722;
                pcVar24 = (char *)*puVar32;
                goto LAB_0014c5cf;
              }
              pcVar36 = (char *)*puVar32;
              iVar16 = strcmp(pcVar24,pcVar36);
              plVar34 = ctx->ctx;
              if (iVar16 != 0) {
LAB_0014c733:
                pcVar17 = 
                "Invalid deviation deleting \"%s\" property \"%s\" which does not match the target\'s property value \"%s\"."
                ;
                pcVar42 = "default";
                goto LAB_0014c5cf;
              }
              lydict_remove(plVar34,pcVar24);
              *type = (lysp_node *)0x0;
            }
          }
LAB_0014bf52:
        }
        lVar25 = puVar7[4];
        LVar14 = LY_SUCCESS;
        if (lVar25 != 0) {
          plVar30 = plVar38->exts;
          if (plVar30 == (lysp_ext_instance *)0x0) {
            plVar19 = (long *)calloc(1,*(long *)(lVar25 + -8) * 0x70 | 8);
            if (plVar19 != (long *)0x0) {
              lVar25 = 0;
              plVar21 = (lysp_ext_instance *)0x0;
              goto LAB_0014c0cf;
            }
          }
          else {
            plVar21 = plVar30[-1].exts;
            plVar19 = (long *)realloc(&plVar30[-1].exts,
                                      ((long)&plVar21->name + *(long *)(lVar25 + -8)) * 0x70 | 8);
            if (plVar19 != (long *)0x0) {
              lVar25 = *plVar19;
LAB_0014c0cf:
              plVar38->exts = (lysp_ext_instance *)(plVar19 + 1);
              if (puVar7[4] == 0) {
                sVar27 = 0;
              }
              else {
                sVar27 = *(long *)(puVar7[4] + -8) * 0x70;
              }
              memset(plVar19 + lVar25 * 0xe + 1,0,sVar27);
              uVar39 = 0xffffffffffffffff;
              lVar25 = 0;
              while( true ) {
                if (puVar7[4] == 0) {
                  uVar18 = 0;
                }
                else {
                  uVar18 = *(ulong *)(puVar7[4] + -8);
                }
                uVar39 = uVar39 + 1;
                LVar14 = LY_SUCCESS;
                if (uVar18 <= uVar39) break;
                pplVar1 = &plVar38->exts[-1].exts;
                *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)->name + 1);
                plVar34 = ctx->ctx;
                lVar15 = lyplg_ext_nodetype2stmt(plVar38->nodetype);
                LVar14 = lysp_ext_dup(plVar34,plVar8,plVar38,lVar15,
                                      (lysp_ext_instance *)(puVar7[4] + lVar25),
                                      (lysp_ext_instance *)
                                      ((long)&plVar38->exts[(long)plVar21].name + lVar25));
                lVar25 = lVar25 + 0x70;
                if (LVar14 != LY_SUCCESS) goto LAB_0014c806;
              }
              goto LAB_0014c5de;
            }
          }
          plVar34 = ctx->ctx;
          pcVar35 = "lys_apply_deviation";
LAB_0014c849:
          LVar14 = LY_EMEM;
          ly_log(plVar34,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar35);
          break;
        }
LAB_0014c5de:
        ctx->cur_mod = plVar40;
        ctx->pmod = plVar11;
        strcpy(pcVar35,local_1028);
        sVar27 = strlen(pcVar35);
        ctx->path_len = (uint32_t)sVar27;
        pvVar26 = (void *)((long)pvVar26 + 1);
      } while (LVar14 == LY_SUCCESS);
    }
LAB_0014c806:
    lysp_dev_node_free(ctx,*dev_pnode);
    *dev_pnode = (lysp_node *)0x0;
    *not_supported = '\0';
    return LVar14;
  }
  *not_supported = '\x01';
LAB_0014b42a:
  lysc_deviation_free(ctx->ctx,(lysc_deviation *)plVar5);
  ly_set_rm_index(&ctx->devs,(uint32_t)uVar29,(_func_void_void_ptr *)0x0);
  return LY_SUCCESS;
code_r0x0014ba32:
  uVar39 = uVar39 + 1;
  plVar33 = *(lysp_qname **)(pcVar17 + 0x30);
  lVar25 = lVar25 + 0x18;
  goto LAB_0014b98d;
}

Assistant:

LY_ERR
lys_compile_node_deviations_refines(struct lysc_ctx *ctx, const struct lysp_node *pnode, const struct lysc_node *parent,
        struct lysp_node **dev_pnode, ly_bool *not_supported)
{
    LY_ERR ret = LY_SUCCESS;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;
    struct lysc_refine *rfn;
    struct lysc_deviation *dev;

    *dev_pnode = NULL;
    *not_supported = 0;

    for (i = 0; i < ctx->uses_rfns.count; ) {
        rfn = ctx->uses_rfns.objs[i];

        if (!lysp_schema_nodeid_match(rfn->nodeid, rfn->nodeid_pmod, NULL, rfn->nodeid_ctx_node, parent, pnode,
                ctx->cur_mod, ctx->ext)) {
            /* not our target node */
            ++i;
            continue;
        }

        if (!*dev_pnode) {
            /* first refine on this node, create a copy first */
            LY_CHECK_GOTO(ret = lysp_dup_single(ctx, pnode, 1, dev_pnode), cleanup);
        }

        /* apply all the refines by changing (the copy of) the parsed node */
        LY_ARRAY_FOR(rfn->rfns, u) {
            LY_CHECK_GOTO(ret = lys_apply_refine(ctx, rfn->rfns[u], rfn->nodeid_pmod, *dev_pnode), cleanup);
        }

        /* refine was applied, remove it */
        lysc_refine_free(ctx->ctx, rfn);
        ly_set_rm_index(&ctx->uses_rfns, i, NULL);

        /* refines use relative paths so more may apply to a single node */
    }

    for (i = 0; i < ctx->devs.count; ++i) {
        dev = ctx->devs.objs[i];

        if (!lysp_schema_nodeid_match(dev->nodeid, dev->dev_pmods[0], NULL, NULL, parent, pnode, ctx->cur_mod, ctx->ext)) {
            /* not our target node */
            continue;
        }

        if (dev->not_supported) {
            /* it is not supported, no more deviations */
            *not_supported = 1;
            goto dev_applied;
        }

        if (!*dev_pnode) {
            /* first deviation on this node, create a copy first */
            LY_CHECK_GOTO(ret = lysp_dup_single(ctx, pnode, 1, dev_pnode), cleanup);
        }

        /* apply all the deviates by changing (the copy of) the parsed node */
        LY_ARRAY_FOR(dev->devs, u) {
            LY_CHECK_GOTO(ret = lys_apply_deviation(ctx, dev->devs[u], dev->dev_pmods[u], *dev_pnode), cleanup);
        }

dev_applied:
        /* deviation was applied, remove it */
        lysc_deviation_free(ctx->ctx, dev);
        ly_set_rm_index(&ctx->devs, i, NULL);

        /* all the deviations for one target node are in one structure, we are done */
        break;
    }

cleanup:
    if (ret) {
        lysp_dev_node_free(ctx, *dev_pnode);
        *dev_pnode = NULL;
        *not_supported = 0;
    }
    return ret;
}